

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorConstrainedPOMDP.cpp
# Opt level: O2

AlphaVector * __thiscall
AlphaVectorConstrainedPOMDP::BeliefBackup
          (AlphaVector *__return_storage_ptr__,AlphaVectorConstrainedPOMDP *this,
          JointBeliefInterface *b,Index a,GaoVectorSet *G)

{
  undefined1 auVar1 [16];
  _func_int *p_Var2;
  VectorSet *v;
  long *plVar3;
  AlphaVector *pAVar4;
  int iVar5;
  size_t sVar6;
  long lVar7;
  reference pvVar8;
  ulong uVar9;
  PlanningUnitMADPDiscrete *this_00;
  GaoVectorSetIndex o;
  value_type vVar10;
  ulong uVar11;
  int s;
  size_type __n;
  double dVar12;
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  vector<double,_std::allocator<double>_> Gab;
  allocator<char> local_a1;
  value_type local_a0;
  Index local_94;
  AlphaVector *local_90;
  _Vector_base<double,_std::allocator<double>_> local_88;
  string local_70;
  size_t local_50;
  ulong local_48;
  JointBeliefInterface *local_40;
  GaoVectorSet *local_38;
  undefined1 extraout_var [56];
  
  lVar7 = *(long *)(&this->field_0x10 + (long)this->_vptr_AlphaVectorConstrainedPOMDP[-3]);
  if (lVar7 == 0) {
    lVar7 = *(long *)(&this->field_0x18 + (long)this->_vptr_AlphaVectorConstrainedPOMDP[-3]);
  }
  local_90 = __return_storage_ptr__;
  local_40 = b;
  local_38 = G;
  iVar5 = (**(code **)(**(long **)(lVar7 + 0x30) + 200))();
  this_00 = *(PlanningUnitMADPDiscrete **)
             (&this->field_0x10 + (long)this->_vptr_AlphaVectorConstrainedPOMDP[-3]);
  if (this_00 == (PlanningUnitMADPDiscrete *)0x0) {
    this_00 = *(PlanningUnitMADPDiscrete **)
               (&this->field_0x18 + (long)this->_vptr_AlphaVectorConstrainedPOMDP[-3]);
  }
  sVar6 = PlanningUnitMADPDiscrete::GetNrStates(this_00);
  p_Var2 = this->_vptr_AlphaVectorConstrainedPOMDP[-3];
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"BeliefBackupPOMDP",(allocator<char> *)&local_88);
  TimedAlgorithm::StartTimer
            ((TimedAlgorithm *)((long)&this->_vptr_AlphaVectorConstrainedPOMDP + (long)p_Var2),
             &local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_88,(long)(int)sVar6,
             (allocator_type *)&local_70);
  uVar11 = sVar6 & 0xffffffff;
  for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
    lVar7 = *(long *)(&this->field_0x10 + (long)this->_vptr_AlphaVectorConstrainedPOMDP[-3]);
    if (lVar7 == 0) {
      lVar7 = *(long *)(&this->field_0x18 + (long)this->_vptr_AlphaVectorConstrainedPOMDP[-3]);
    }
    dVar12 = (double)(**(code **)(**(long **)(lVar7 + 0x330) + 0xc0))
                               (*(long **)(lVar7 + 0x330),uVar9 & 0xffffffff,a);
    local_88._M_impl.super__Vector_impl_data._M_start[uVar9] = dVar12;
  }
  local_a0 = (value_type)(long)iVar5;
  local_48 = (ulong)a;
  local_94 = a;
  local_50 = (long)(int)sVar6;
  for (vVar10 = 0.0; pAVar4 = local_90, vVar10 != local_a0; vVar10 = (value_type)((long)vVar10 + 1))
  {
    v = (local_38->
        super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
        ).
        super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
        .base_[(local_38->
               super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
               ).
               super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
               .origin_offset_ +
               (local_38->
               super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
               ).
               super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
               .stride_list_.elems[0] * local_48 +
               (local_38->
               super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
               ).
               super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
               .stride_list_.elems[1] * (long)vVar10];
    iVar5 = BeliefValue::GetMaximizingVectorIndex
                      ((BeliefInterface *)
                       ((long)&local_40->field_0x0 + *(long *)((long)*local_40 + -0xb8)),v);
    for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
      lVar7 = *(long *)(&this->field_0x10 + (long)this->_vptr_AlphaVectorConstrainedPOMDP[-3]);
      if (lVar7 == 0) {
        lVar7 = *(long *)(&this->field_0x18 + (long)this->_vptr_AlphaVectorConstrainedPOMDP[-3]);
      }
      plVar3 = *(long **)(lVar7 + 0x330);
      auVar13._0_8_ =
           (**(code **)(*(long *)((long)plVar3 + *(long *)(*plVar3 + -0xb0)) + 0x70))
                     ((long)plVar3 + *(long *)(*plVar3 + -0xb0));
      auVar13._8_56_ = extraout_var;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = (v->data_).data_[v->size2_ * (long)iVar5 + uVar9];
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_88._M_impl.super__Vector_impl_data._M_start[uVar9];
      auVar1 = vfmadd213sd_fma(auVar14,auVar13._0_16_,auVar1);
      local_88._M_impl.super__Vector_impl_data._M_start[uVar9] = auVar1._0_8_;
    }
  }
  AlphaVector::AlphaVector(local_90,local_50);
  pAVar4->_m_action = local_94;
  for (__n = 0; uVar11 != __n; __n = __n + 1) {
    local_a0 = local_88._M_impl.super__Vector_impl_data._M_start[__n];
    pvVar8 = std::vector<double,_std::allocator<double>_>::at(&pAVar4->_m_values,__n);
    *pvVar8 = local_a0;
  }
  p_Var2 = this->_vptr_AlphaVectorConstrainedPOMDP[-3];
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"BeliefBackupPOMDP",&local_a1);
  TimedAlgorithm::StopTimer
            ((TimedAlgorithm *)((long)&this->_vptr_AlphaVectorConstrainedPOMDP + (long)p_Var2),
             &local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_88);
  return pAVar4;
}

Assistant:

AlphaVector AlphaVectorConstrainedPOMDP::BeliefBackup(const JointBeliefInterface &b,
                                                      Index a,
                                                      const GaoVectorSet &G) const
{
    int nrO=GetPU()->GetNrJointObservations(),
        nrS=GetPU()->GetNrStates();
    VectorSet *VS;
    // stores the index of the vector that maximizes b's value
    int maximizingVectorI;

    StartTimer("BeliefBackupPOMDP");

    vector<double> Gab(nrS);

    // initialize Gab vector with the immediate reward
    for(int s=0;s!=nrS;s++)
        Gab[s]=GetPU()->GetReward(s,a);
    
    for(GaoVectorSetIndex o=0;o!=nrO;o++)
    {
        VS=G[a][o];
        maximizingVectorI=BeliefValue::GetMaximizingVectorIndex(b,*VS);
        
        // add discounted maximizing vector (3.16)
        for(int s=0;s!=nrS;s++)
            Gab[s]+=GetPU()->GetDiscount()*
                (*VS)(maximizingVectorI,s);
    }

    // create the vector for b
    AlphaVector newVector(nrS);
    newVector.SetAction(a);
    for(int s=0;s!=nrS;s++)
        newVector.SetValue(Gab[s],s);

    StopTimer("BeliefBackupPOMDP");

    return(newVector);
}